

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall Fn_Anonymous_Test::TestBody(Fn_Anonymous_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_758;
  Message local_750;
  int local_748;
  uint8_t local_741;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_24;
  Message local_728;
  int local_720;
  uint8_t local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar_23;
  Message local_700;
  int local_6f8;
  uint8_t local_6f1;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_22;
  Message local_6d8;
  BcOp local_6d0;
  BcOp local_6cc;
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar_21;
  undefined1 local_6b0 [4];
  BcIns ins_6;
  AssertHelper local_690;
  Message local_688;
  bool local_679;
  undefined1 local_678 [8];
  AssertionResult gtest_ar__6;
  Message local_660;
  int local_658;
  uint8_t local_651;
  undefined1 local_650 [8];
  AssertionResult gtest_ar_20;
  Message local_638;
  int local_630;
  uint8_t local_629;
  undefined1 local_628 [8];
  AssertionResult gtest_ar_19;
  Message local_610;
  int local_608;
  uint8_t local_601;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_18;
  Message local_5e8;
  BcOp local_5e0;
  BcOp local_5dc;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_17;
  undefined1 local_5c0 [4];
  BcIns ins_5;
  AssertHelper local_5a0;
  Message local_598;
  bool local_589;
  undefined1 local_588 [8];
  AssertionResult gtest_ar__5;
  Message local_570;
  int local_568;
  uint8_t local_561;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_16;
  Message local_548;
  int local_540;
  uint8_t local_539;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_15;
  Message local_520;
  int local_518;
  uint8_t local_511;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_14;
  Message local_4f8;
  BcOp local_4f0;
  BcOp local_4ec;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_13;
  undefined1 local_4d0 [4];
  BcIns ins_4;
  AssertHelper local_4b0;
  Message local_4a8;
  bool local_499;
  undefined1 local_498 [8];
  AssertionResult gtest_ar__4;
  Message local_480;
  int local_478;
  uint16_t local_472;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_12;
  Message local_458;
  int local_450;
  uint8_t local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_11;
  Message local_430;
  BcOp local_428;
  BcOp local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_10;
  undefined1 local_408 [4];
  BcIns ins_3;
  AssertHelper local_3e8;
  Message local_3e0;
  bool local_3d1;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__3;
  Message local_3b8;
  int local_3b0;
  uint8_t local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_9;
  Message local_390;
  int local_388;
  uint8_t local_381;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_8;
  Message local_368;
  int local_360;
  uint8_t local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_7;
  Message local_340;
  BcOp local_338;
  BcOp local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_6;
  undefined1 local_318 [4];
  BcIns ins_2;
  AssertHelper local_2f8;
  Message local_2f0;
  bool local_2e1;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__2;
  Message local_2c8;
  int local_2c0;
  uint16_t local_2ba;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_5;
  Message local_2a0;
  int local_298;
  uint8_t local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_4;
  Message local_278;
  BcOp local_270;
  BcOp local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_250 [4];
  BcIns ins_1;
  AssertHelper local_230;
  Message local_228;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__1;
  Message local_200;
  int local_1f8;
  uint16_t local_1f2;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_2;
  Message local_1d8;
  int local_1d0;
  uint8_t local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_1;
  Message local_1b0;
  BcOp local_1a8;
  BcOp local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  BcIns ins;
  AssertHelper local_168;
  Message local_160 [3];
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_;
  MockParser mock;
  Fn_Anonymous_Test *this_local;
  
  MockParser::MockParser
            ((MockParser *)&gtest_ar_.message_,
             "let a = fn() {\n  let b = 3\n}\nlet b = (fn(a, b, c) {\n  let d = a + b\n})\n");
  local_141 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ins,(internal *)local_140,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x3bd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&ins);
    testing::Message::~Message(local_160);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    gtest_ar.message_.ptr_._0_4_ = MockParser::next((MockParser *)&gtest_ar_.message_);
    local_1a4 = bc_op((BcIns)gtest_ar.message_.ptr_);
    local_1a8 = BC_SET_F;
    testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
              ((EqHelper<false> *)local_1a0,"bc_op(ins)","BC_SET_F",&local_1a4,&local_1a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0x3bd,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_1b0);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      local_1c9 = bc_arg1((BcIns)gtest_ar.message_.ptr_);
      local_1d0 = 0;
      testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                ((EqHelper<false> *)local_1c8,"bc_arg1(ins)","0",&local_1c9,&local_1d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
      if (!bVar1) {
        testing::Message::Message(&local_1d8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x3bd,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1d8);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
      if (gtest_ar.message_.ptr_._4_4_ == 0) {
        local_1f2 = bc_arg16((BcIns)gtest_ar.message_.ptr_);
        local_1f8 = 1;
        testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                  ((EqHelper<false> *)local_1f0,"bc_arg16(ins)","1",&local_1f2,&local_1f8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
        if (!bVar1) {
          testing::Message::Message(&local_200);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                     ,0x3bd,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__1.message_,&local_200);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
          testing::Message::~Message(&local_200);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
        if (gtest_ar.message_.ptr_._4_4_ == 0) {
          local_219 = mock.cur_fn <
                      (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_218,&local_219,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
          if (!bVar1) {
            testing::Message::Message(&local_228);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_250,(internal *)local_218,
                       (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count",
                       "false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_230,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                       ,0x3be,pcVar2);
            testing::internal::AssertHelper::operator=(&local_230,&local_228);
            testing::internal::AssertHelper::~AssertHelper(&local_230);
            std::__cxx11::string::~string((string *)local_250);
            testing::Message::~Message(&local_228);
          }
          gtest_ar.message_.ptr_._5_3_ = 0;
          gtest_ar.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
          if (gtest_ar.message_.ptr_._4_4_ == 0) {
            gtest_ar_3.message_.ptr_._4_4_ = MockParser::next((MockParser *)&gtest_ar_.message_);
            local_26c = bc_op(gtest_ar_3.message_.ptr_._4_4_);
            local_270 = BC_SET_F;
            testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                      ((EqHelper<false> *)local_268,"bc_op(ins)","BC_SET_F",&local_26c,&local_270);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
            if (!bVar1) {
              testing::Message::Message(&local_278);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                         ,0x3be,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_4.message_,&local_278);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
              testing::Message::~Message(&local_278);
            }
            gtest_ar.message_.ptr_._5_3_ = 0;
            gtest_ar.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
            if (gtest_ar.message_.ptr_._4_4_ == 0) {
              local_291 = bc_arg1(gtest_ar_3.message_.ptr_._4_4_);
              local_298 = 1;
              testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                        ((EqHelper<false> *)local_290,"bc_arg1(ins)","1",&local_291,&local_298);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
              if (!bVar1) {
                testing::Message::Message(&local_2a0);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                           ,0x3be,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_5.message_,&local_2a0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_)
                ;
                testing::Message::~Message(&local_2a0);
              }
              gtest_ar.message_.ptr_._5_3_ = 0;
              gtest_ar.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                local_2ba = bc_arg16(gtest_ar_3.message_.ptr_._4_4_);
                local_2c0 = 2;
                testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                          ((EqHelper<false> *)local_2b8,"bc_arg16(ins)","2",&local_2ba,&local_2c0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2b8);
                if (!bVar1) {
                  testing::Message::Message(&local_2c8);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                             ,0x3be,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__2.message_,&local_2c8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_);
                  testing::Message::~Message(&local_2c8);
                }
                gtest_ar.message_.ptr_._5_3_ = 0;
                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                  local_2e1 = mock.cur_fn <
                              (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_2e0,&local_2e1,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2e0);
                  if (!bVar1) {
                    testing::Message::Message(&local_2f0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_318,(internal *)local_2e0,
                               (AssertionResult *)
                               "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true",
                               in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2f8,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                               ,0x3bf,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
                    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
                    std::__cxx11::string::~string((string *)local_318);
                    testing::Message::~Message(&local_2f0);
                  }
                  gtest_ar.message_.ptr_._5_3_ = 0;
                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                    gtest_ar_6.message_.ptr_._4_4_ =
                         MockParser::next((MockParser *)&gtest_ar_.message_);
                    local_334 = bc_op(gtest_ar_6.message_.ptr_._4_4_);
                    local_338 = BC_RET;
                    testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                              ((EqHelper<false> *)local_330,"bc_op(ins)","BC_RET",&local_334,
                               &local_338);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_330);
                    if (!bVar1) {
                      testing::Message::Message(&local_340);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_330);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                 ,0x3bf,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_7.message_,&local_340);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_7.message_);
                      testing::Message::~Message(&local_340);
                    }
                    gtest_ar.message_.ptr_._5_3_ = 0;
                    gtest_ar.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
                    if (gtest_ar.message_.ptr_._4_4_ == 0) {
                      local_359 = bc_arg1(gtest_ar_6.message_.ptr_._4_4_);
                      local_360 = 0;
                      testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                                ((EqHelper<false> *)local_358,"bc_arg1(ins)","0",&local_359,
                                 &local_360);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_358);
                      if (!bVar1) {
                        testing::Message::Message(&local_368);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_358);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                   ,0x3bf,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_8.message_,&local_368);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_8.message_);
                        testing::Message::~Message(&local_368);
                      }
                      gtest_ar.message_.ptr_._5_3_ = 0;
                      gtest_ar.message_.ptr_._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
                      if (gtest_ar.message_.ptr_._4_4_ == 0) {
                        local_381 = bc_arg2(gtest_ar_6.message_.ptr_._4_4_);
                        local_388 = 0;
                        testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                                  ((EqHelper<false> *)local_380,"bc_arg2(ins)","0",&local_381,
                                   &local_388);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_380);
                        if (!bVar1) {
                          testing::Message::Message(&local_390);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_380);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                     ,0x3bf,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_9.message_,&local_390);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_9.message_);
                          testing::Message::~Message(&local_390);
                        }
                        gtest_ar.message_.ptr_._5_3_ = 0;
                        gtest_ar.message_.ptr_._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
                        if (gtest_ar.message_.ptr_._4_4_ == 0) {
                          local_3a9 = bc_arg3(gtest_ar_6.message_.ptr_._4_4_);
                          local_3b0 = 0;
                          testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                                    ((EqHelper<false> *)local_3a8,"bc_arg3(ins)","0",&local_3a9,
                                     &local_3b0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_3a8);
                          if (!bVar1) {
                            testing::Message::Message(&local_3b8);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_3a8);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar__3.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                       ,0x3bf,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar__3.message_,&local_3b8);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar__3.message_);
                            testing::Message::~Message(&local_3b8);
                          }
                          gtest_ar.message_.ptr_._5_3_ = 0;
                          gtest_ar.message_.ptr_._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
                          if (gtest_ar.message_.ptr_._4_4_ == 0) {
                            local_3d1 = *(int *)(mock.vm._8_8_ + 0x28) != 0;
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_3d0,&local_3d1,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_3d0);
                            if (!bVar1) {
                              testing::Message::Message(&local_3e0);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)local_408,(internal *)local_3d0,
                                         (AssertionResult *)
                                         "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false"
                                         ,"true",in_R9);
                              pcVar2 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_3e8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                         ,0x3c2,pcVar2);
                              testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
                              testing::internal::AssertHelper::~AssertHelper(&local_3e8);
                              std::__cxx11::string::~string((string *)local_408);
                              testing::Message::~Message(&local_3e0);
                            }
                            gtest_ar.message_.ptr_._5_3_ = 0;
                            gtest_ar.message_.ptr_._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0)
                            ;
                            if (gtest_ar.message_.ptr_._4_4_ == 0) {
                              gtest_ar_10.message_.ptr_._4_4_ =
                                   MockParser::next((MockParser *)&gtest_ar_.message_);
                              local_424 = bc_op(gtest_ar_10.message_.ptr_._4_4_);
                              local_428 = BC_SET_N;
                              testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                                        ((EqHelper<false> *)local_420,"bc_op(ins)","BC_SET_N",
                                         &local_424,&local_428);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_420);
                              if (!bVar1) {
                                testing::Message::Message(&local_430);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_420);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                           ,0x3c2,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_11.message_,&local_430);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_11.message_);
                                testing::Message::~Message(&local_430);
                              }
                              gtest_ar.message_.ptr_._5_3_ = 0;
                              gtest_ar.message_.ptr_._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_420);
                              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                local_449 = bc_arg1(gtest_ar_10.message_.ptr_._4_4_);
                                local_450 = 0;
                                testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                                          ((EqHelper<false> *)local_448,"bc_arg1(ins)","0",
                                           &local_449,&local_450);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_448);
                                if (!bVar1) {
                                  testing::Message::Message(&local_458);
                                  pcVar2 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_448);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                             ,0x3c2,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_12.message_,&local_458);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_12.message_);
                                  testing::Message::~Message(&local_458);
                                }
                                gtest_ar.message_.ptr_._5_3_ = 0;
                                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_448);
                                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                  local_472 = bc_arg16(gtest_ar_10.message_.ptr_._4_4_);
                                  local_478 = 0;
                                  testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                                            ((EqHelper<false> *)local_470,"bc_arg16(ins)","0",
                                             &local_472,&local_478);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_470);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_480);
                                    pcVar2 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_470);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar__4.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                               ,0x3c2,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar__4.message_,&local_480);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar__4.message_);
                                    testing::Message::~Message(&local_480);
                                  }
                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_470);
                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                    local_499 = *(int *)(mock.vm._8_8_ + 0x28) != 0;
                                    testing::AssertionResult::AssertionResult<bool>
                                              ((AssertionResult *)local_498,&local_499,(type *)0x0);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_498);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_4a8);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((string *)local_4d0,(internal *)local_498,
                                                 (AssertionResult *)
                                                 "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                 ,"false","true",in_R9);
                                      pcVar2 = (char *)std::__cxx11::string::c_str();
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_4b0,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                 ,0x3c3,pcVar2);
                                      testing::internal::AssertHelper::operator=
                                                (&local_4b0,&local_4a8);
                                      testing::internal::AssertHelper::~AssertHelper(&local_4b0);
                                      std::__cxx11::string::~string((string *)local_4d0);
                                      testing::Message::~Message(&local_4a8);
                                    }
                                    gtest_ar.message_.ptr_._5_3_ = 0;
                                    gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_498);
                                    if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                      gtest_ar_13.message_.ptr_._4_4_ =
                                           MockParser::next((MockParser *)&gtest_ar_.message_);
                                      local_4ec = bc_op(gtest_ar_13.message_.ptr_._4_4_);
                                      local_4f0 = BC_RET;
                                      testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                                                ((EqHelper<false> *)local_4e8,"bc_op(ins)","BC_RET",
                                                 &local_4ec,&local_4f0);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_4e8);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_4f8);
                                        pcVar2 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_4e8);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_14.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c3,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_14.message_,&local_4f8)
                                        ;
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_14.message_);
                                        testing::Message::~Message(&local_4f8);
                                      }
                                      gtest_ar.message_.ptr_._5_3_ = 0;
                                      gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_4e8);
                                      if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                        local_511 = bc_arg1(gtest_ar_13.message_.ptr_._4_4_);
                                        local_518 = 0;
                                        testing::internal::EqHelper<false>::
                                        Compare<unsigned_char,int>
                                                  ((EqHelper<false> *)local_510,"bc_arg1(ins)","0",
                                                   &local_511,&local_518);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_510);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_520);
                                          pcVar2 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_510);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_15.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c3,pcVar2);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_15.message_,
                                                     &local_520);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar_15.message_);
                                          testing::Message::~Message(&local_520);
                                        }
                                        gtest_ar.message_.ptr_._5_3_ = 0;
                                        gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_510);
                                        if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                          local_539 = bc_arg2(gtest_ar_13.message_.ptr_._4_4_);
                                          local_540 = 0;
                                          testing::internal::EqHelper<false>::
                                          Compare<unsigned_char,int>
                                                    ((EqHelper<false> *)local_538,"bc_arg2(ins)","0"
                                                     ,&local_539,&local_540);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_538);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_548);
                                            pcVar2 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_538);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar_16.message_,
                                                       kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c3,pcVar2);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar_16.message_,
                                                       &local_548);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)&gtest_ar_16.message_);
                                            testing::Message::~Message(&local_548);
                                          }
                                          gtest_ar.message_.ptr_._5_3_ = 0;
                                          gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_538);
                                          if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                            local_561 = bc_arg3(gtest_ar_13.message_.ptr_._4_4_);
                                            local_568 = 0;
                                            testing::internal::EqHelper<false>::
                                            Compare<unsigned_char,int>
                                                      ((EqHelper<false> *)local_560,"bc_arg3(ins)",
                                                       "0",&local_561,&local_568);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_560);
                                            if (!bVar1) {
                                              testing::Message::Message(&local_570);
                                              pcVar2 = testing::AssertionResult::failure_message
                                                                 ((AssertionResult *)local_560);
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&gtest_ar__5.message_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c3,pcVar2);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&gtest_ar__5.message_,
                                                         &local_570);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        ((AssertHelper *)&gtest_ar__5.message_);
                                              testing::Message::~Message(&local_570);
                                            }
                                            gtest_ar.message_.ptr_._5_3_ = 0;
                                            gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_560);
                                            if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                              local_589 = *(int *)(mock.vm._8_8_ + 0x40) != 0;
                                              testing::AssertionResult::AssertionResult<bool>
                                                        ((AssertionResult *)local_588,&local_589,
                                                         (type *)0x0);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_588);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_598);
                                                testing::internal::
                                                GetBoolAssertionFailureMessage_abi_cxx11_
                                                          ((string *)local_5c0,(internal *)local_588
                                                           ,(AssertionResult *)
                                                                                                                        
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_5a0,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c6,pcVar2);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_5a0,&local_598);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_5a0);
                                                std::__cxx11::string::~string((string *)local_5c0);
                                                testing::Message::~Message(&local_598);
                                              }
                                              gtest_ar.message_.ptr_._5_3_ = 0;
                                              gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_588);
                                              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                gtest_ar_17.message_.ptr_._4_4_ =
                                                     MockParser::next((MockParser *)
                                                                      &gtest_ar_.message_);
                                                local_5dc = bc_op(gtest_ar_17.message_.ptr_._4_4_);
                                                local_5e0 = BC_ADD_LL;
                                                testing::internal::EqHelper<false>::
                                                Compare<BcOp,BcOp>((EqHelper<false> *)local_5d8,
                                                                   "bc_op(ins)","BC_ADD_LL",
                                                                   &local_5dc,&local_5e0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_5d8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_5e8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_5d8);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_18.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c6,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_18.message_,
                                                             &local_5e8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_18.message_);
                                                  testing::Message::~Message(&local_5e8);
                                                }
                                                gtest_ar.message_.ptr_._5_3_ = 0;
                                                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_5d8);
                                                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                  local_601 = bc_arg1(gtest_ar_17.message_.ptr_.
                                                                      _4_4_);
                                                  local_608 = 3;
                                                  testing::internal::EqHelper<false>::
                                                  Compare<unsigned_char,int>
                                                            ((EqHelper<false> *)local_600,
                                                             "bc_arg1(ins)","3",&local_601,
                                                             &local_608);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_600);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_610);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_600);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_19.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c6,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_19.message_,
                                                             &local_610);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_19.message_);
                                                  testing::Message::~Message(&local_610);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_600);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_629 = bc_arg2(gtest_ar_17.message_.ptr_.
                                                                        _4_4_);
                                                    local_630 = 0;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_628,
                                                               "bc_arg2(ins)","0",&local_629,
                                                               &local_630);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_628)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_638);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_628);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_20.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c6,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_20.message_,
                                                             &local_638);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_20.message_);
                                                  testing::Message::~Message(&local_638);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_628);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_651 = bc_arg3(gtest_ar_17.message_.ptr_.
                                                                        _4_4_);
                                                    local_658 = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_650,
                                                               "bc_arg3(ins)","1",&local_651,
                                                               &local_658);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_650)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_660);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_650);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__6.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c6,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__6.message_,
                                                             &local_660);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__6.message_);
                                                  testing::Message::~Message(&local_660);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_650);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_679 = *(int *)(mock.vm._8_8_ + 0x40) != 0;
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_678,
                                                               &local_679,(type *)0x0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_678)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_688);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)local_6b0,
                                                                 (internal *)local_678,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_690,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_690,&local_688);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_690);
                                                  std::__cxx11::string::~string((string *)local_6b0)
                                                  ;
                                                  testing::Message::~Message(&local_688);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_678);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_21.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_6cc = bc_op(gtest_ar_21.message_.ptr_.
                                                                      _4_4_);
                                                    local_6d0 = BC_RET;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_6c8,
                                                                       "bc_op(ins)","BC_RET",
                                                                       &local_6cc,&local_6d0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6c8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_6d8);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_6c8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_22.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_22.message_,
                                                             &local_6d8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_22.message_);
                                                  testing::Message::~Message(&local_6d8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6c8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_6f1 = bc_arg1(gtest_ar_21.message_.ptr_.
                                                                        _4_4_);
                                                    local_6f8 = 0;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_6f0,
                                                               "bc_arg1(ins)","0",&local_6f1,
                                                               &local_6f8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6f0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_700);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_6f0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_23.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_23.message_,
                                                             &local_700);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_23.message_);
                                                  testing::Message::~Message(&local_700);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6f0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_719 = bc_arg2(gtest_ar_21.message_.ptr_.
                                                                        _4_4_);
                                                    local_720 = 0;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_718,
                                                               "bc_arg2(ins)","0",&local_719,
                                                               &local_720);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_718)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_728);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_718);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_24.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_24.message_,
                                                             &local_728);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_24.message_);
                                                  testing::Message::~Message(&local_728);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_718);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_741 = bc_arg3(gtest_ar_21.message_.ptr_.
                                                                        _4_4_);
                                                    local_748 = 0;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_740,
                                                               "bc_arg3(ins)","0",&local_741,
                                                               &local_748);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_740)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_750);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_740);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_758,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3c7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_758,&local_750);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_758);
                                                  testing::Message::~Message(&local_750);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_740);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar.message_.ptr_._4_4_ = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  MockParser::~MockParser((MockParser *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(Fn, Anonymous) {
	MockParser mock(
		"let a = fn() {\n"
		"  let b = 3\n"
		"}\n"
		"let b = (fn(a, b, c) {\n"
		"  let d = a + b\n"
		"})\n"
	);

	INS2(BC_SET_F, 0, 1);
	INS2(BC_SET_F, 1, 2);
	INS(BC_RET, 0, 0, 0);

	FN(1);
	INS2(BC_SET_N, 0, 0);
	INS(BC_RET, 0, 0, 0);

	FN(2);
	INS(BC_ADD_LL, 3, 0, 1);
	INS(BC_RET, 0, 0, 0);
}